

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::HttpServer::Connection::sendWebSocketError::BrokenWebSocket::disconnect(BrokenWebSocket *this)

{
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar1;
  Exception EStack_168;
  
  Exception::Exception(&EStack_168,(Exception *)(in_RSI + 8));
  Promise<void>::Promise((Promise<void> *)this,&EStack_168);
  Exception::~Exception(&EStack_168);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> disconnect() override {
        return kj::cp(exception);
      }